

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O2

FUNCTION_RETURN encode_pc_id(uchar *identifier1,uchar *identifier2,char *pc_identifier_out)

{
  char *__ptr;
  FUNCTION_RETURN FVar1;
  int b64_size;
  PcIdentifier concat_identifiers [2];
  
  b64_size = 0;
  concat_identifiers[0]._0_4_ = *(undefined4 *)identifier1;
  concat_identifiers[0]._4_2_ = *(undefined2 *)(identifier1 + 4);
  concat_identifiers[1]._0_4_ = *(undefined4 *)identifier2;
  concat_identifiers[1]._4_2_ = *(undefined2 *)(identifier2 + 4);
  __ptr = base64(concat_identifiers,0xc,&b64_size);
  if ((uint)b64_size < 0x16) {
    FVar1 = FUNC_RET_OK;
    sprintf(pc_identifier_out,"%.4s-%.4s-%.4s-%.4s",__ptr,__ptr + 4,__ptr + 8,__ptr + 0xc);
  }
  else {
    FVar1 = FUNC_RET_BUFFER_TOO_SMALL;
  }
  free(__ptr);
  return FVar1;
}

Assistant:

FUNCTION_RETURN encode_pc_id(PcIdentifier identifier1, PcIdentifier identifier2,
		PcSignature pc_identifier_out) {
	//TODO base62 encoding, now uses base64
	PcIdentifier concat_identifiers[2];
	char* b64_data = NULL;
	int b64_size = 0;
	size_t concatIdentifiersSize = sizeof(PcIdentifier) * 2;
	//concat_identifiers = (PcIdentifier *) malloc(concatIdentifiersSize);
	memcpy(&concat_identifiers[0], identifier1, sizeof(PcIdentifier));
	memcpy(&concat_identifiers[1], identifier2, sizeof(PcIdentifier));
	b64_data = base64(concat_identifiers, concatIdentifiersSize, &b64_size);
	if (b64_size > sizeof(PcSignature)) {
		free(b64_data);
		return FUNC_RET_BUFFER_TOO_SMALL;
	}
	sprintf(pc_identifier_out, "%.4s-%.4s-%.4s-%.4s", &b64_data[0],
			&b64_data[4], &b64_data[8], &b64_data[12]);
	//free(concat_identifiers);
	free(b64_data);
	return FUNC_RET_OK;
}